

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage(MemoryLeakDetector *this)

{
  void *memory;
  TestMemoryAllocator *allocator;
  MemoryLeakDetectorNode *leak;
  
  leak = MemoryLeakDetectorTable::getFirstLeakForAllocationStage
                   (&this->memoryTable_,this->current_allocation_stage_);
  while (leak != (MemoryLeakDetectorNode *)0x0) {
    memory = *(void **)(leak + 0x10);
    allocator = *(TestMemoryAllocator **)(leak + 0x28);
    leak = MemoryLeakDetectorTable::getNextLeakForAllocationStage
                     (&this->memoryTable_,leak,this->current_allocation_stage_);
    deallocMemory(this,allocator,memory,
                  "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/MemoryLeakDetector.cpp"
                  ,0x2bf,false);
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage()
{
    char* memory = NULLPTR;
    MemoryLeakDetectorNode* node = memoryTable_.getFirstLeakForAllocationStage(current_allocation_stage_);
    while (node) {
        memory = node->memory_;
        TestMemoryAllocator* allocator = node->allocator_;
        node = memoryTable_.getNextLeakForAllocationStage(node, current_allocation_stage_);
        deallocMemory(allocator, memory, __FILE__, __LINE__);
    }
}